

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffi2c(LONGLONG ival,char *cval,int *status)

{
  int iVar1;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    *cval = '\0';
    iVar1 = sprintf(cval,"%lld",ival);
    if (iVar1 < 0) {
      ffpmsg("Error in ffi2c converting integer to string");
      *status = 0x191;
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffi2c(LONGLONG ival,  /* I - value to be converted to a string */
          char *cval,     /* O - character string representation of the value */
          int *status)    /* IO - error status */
/*
  convert  value to a null-terminated formatted string.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
    if (sprintf(cval, "%I64d", ival) < 0)

#elif (USE_LL_SUFFIX == 1)
    if (sprintf(cval, "%lld", ival) < 0)
#else
    if (sprintf(cval, "%ld", ival) < 0)
#endif
    {
        ffpmsg("Error in ffi2c converting integer to string");
        *status = BAD_I2C;
    }
    return(*status);
}